

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

aiNode * __thiscall Assimp::B3DImporter::ReadNODE(B3DImporter *this,aiNode *parent)

{
  pointer *pppaVar1;
  iterator __position;
  pointer puVar2;
  pointer puVar3;
  void *__src;
  int iVar4;
  aiNode *this_00;
  _Head_base<0UL,_aiNodeAnim_*,_false> _Var5;
  pointer puVar6;
  void *pvVar7;
  uint uVar8;
  void *__src_00;
  ulong uVar9;
  float fVar10;
  undefined8 extraout_XMM0_Qb;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 in_XMM1_Qa;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  aiQuaternion aVar38;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> nodeAnim;
  aiNode *node;
  aiNode *child;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  string t;
  string name;
  _Head_base<0UL,_aiNodeAnim_*,_false> local_148;
  _Head_base<0UL,_aiNodeAnim_*,_false> local_140;
  float local_134;
  aiNode *local_130;
  void *local_128;
  iterator iStack_120;
  uint *local_118;
  float local_10c;
  void *local_108;
  iterator iStack_100;
  aiNode **local_f8;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  ulong local_d0;
  string local_c8;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  float local_98;
  float local_88;
  float local_78;
  string local_68;
  float local_48;
  
  ReadString_abi_cxx11_(&local_68,this);
  local_10c = ReadFloat(this);
  local_134 = ReadFloat(this);
  local_78 = ReadFloat(this);
  local_88 = ReadFloat(this);
  local_48 = ReadFloat(this);
  local_98 = ReadFloat(this);
  aVar38 = ReadQuat(this);
  uStack_e0 = extraout_XMM0_Qb;
  local_e8 = (undefined1  [8])aVar38._0_8_;
  uStack_a0 = in_XMM1_Qa;
  local_a8 = (undefined1  [8])aVar38._8_8_;
  local_d0 = (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00,&local_68);
  __position._M_current =
       (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_140._M_head_impl = (aiNodeAnim *)this_00;
  if (__position._M_current ==
      (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
              ((vector<aiNode*,std::allocator<aiNode*>> *)&this->_nodes,__position,
               (aiNode **)&local_140);
  }
  else {
    *__position._M_current = this_00;
    pppaVar1 = &(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  fVar10 = (float)local_a8._0_4_ * (float)local_a8._0_4_ +
           (float)local_a8._4_4_ * (float)local_a8._4_4_;
  fVar16 = 1.0 - (fVar10 + fVar10);
  fVar17 = (float)local_e8._4_4_ * (float)local_a8._0_4_ -
           (float)local_a8._4_4_ * (float)local_e8._0_4_;
  fVar23 = (float)local_a8._4_4_ * (float)local_e8._0_4_ +
           (float)local_e8._4_4_ * (float)local_a8._0_4_;
  fVar10 = (float)local_a8._4_4_ * (float)local_a8._4_4_ +
           (float)local_e8._4_4_ * (float)local_e8._4_4_;
  fVar20 = 1.0 - (fVar10 + fVar10);
  fVar21 = (float)local_e8._4_4_ * (float)local_a8._4_4_ +
           (float)local_e8._0_4_ * (float)local_a8._0_4_;
  fVar32 = (float)local_e8._4_4_ * (float)local_a8._4_4_ -
           (float)local_e8._0_4_ * (float)local_a8._0_4_;
  fVar11 = (float)local_a8._4_4_ * (float)local_a8._0_4_ -
           (float)local_e8._4_4_ * (float)local_e8._0_4_;
  fVar14 = (float)local_e8._4_4_ * (float)local_e8._0_4_ +
           (float)local_a8._4_4_ * (float)local_a8._0_4_;
  fVar23 = fVar23 + fVar23;
  fVar26 = fVar23 * 0.0;
  fVar29 = fVar16 * 0.0;
  fVar15 = fVar29 + fVar26;
  fVar17 = fVar17 + fVar17;
  fVar27 = fVar20 * 0.0;
  fVar18 = fVar17 * 0.0;
  fVar19 = fVar18 + fVar27;
  fVar21 = fVar21 + fVar21;
  fVar11 = fVar11 + fVar11;
  fVar12 = fVar11 * 0.0;
  fVar30 = ((float)local_e8._4_4_ * (float)local_e8._4_4_ +
           (float)local_a8._0_4_ * (float)local_a8._0_4_) * -2.0 + 1.0;
  fVar31 = fVar21 * 0.0 + fVar12;
  fVar32 = fVar32 + fVar32;
  fVar14 = fVar14 + fVar14;
  fVar13 = fVar32 * 0.0;
  fVar10 = local_10c * 0.0;
  fVar26 = fVar16 + fVar26 + fVar13 + fVar10;
  fVar28 = fVar14 * 0.0;
  fVar34 = fVar17 + fVar27 + fVar28 + fVar10;
  fVar27 = fVar30 * 0.0;
  fVar10 = fVar21 + fVar12 + fVar27 + fVar10;
  fVar12 = local_134 * 0.0;
  fVar24 = fVar23 + fVar29 + fVar13 + fVar12;
  fVar29 = fVar20 + fVar18 + fVar28 + fVar12;
  fVar12 = fVar21 * 0.0 + fVar11 + fVar27 + fVar12;
  fVar11 = local_78 * 0.0;
  fVar33 = fVar32 + fVar15 + fVar11;
  fVar14 = fVar14 + fVar19 + fVar11;
  fVar11 = fVar30 + fVar31 + fVar11;
  fVar15 = fVar15 + fVar13;
  _local_a8 = ZEXT416((uint)fVar15);
  fVar35 = fVar34 * 0.0;
  fVar13 = fVar26 * 0.0 + fVar35;
  fVar36 = fVar10 * 0.0;
  fVar37 = (local_10c + 0.0) * 0.0;
  fVar20 = fVar13 + fVar36 + local_10c + 0.0;
  _local_e8 = ZEXT416((uint)fVar20);
  fVar30 = fVar29 * 0.0;
  fVar25 = fVar24 * 0.0 + fVar30;
  fVar32 = fVar12 * 0.0;
  fVar22 = (local_134 + 0.0) * 0.0;
  fVar16 = fVar14 * 0.0;
  fVar19 = fVar19 + fVar28 + 0.0;
  fVar21 = fVar19 * 0.0;
  fVar15 = fVar15 + 0.0;
  fVar17 = fVar16 + fVar33 * 0.0;
  fVar18 = fVar21 + fVar15 * 0.0;
  fVar23 = (local_78 + 0.0) * 0.0;
  fVar27 = fVar31 + fVar27 + 0.0;
  *(aiNode **)((long)local_140._M_head_impl[1].mNodeName.data + 0xc) = parent;
  (local_140._M_head_impl)->mNumPositionKeys = (uint)(fVar37 + fVar36 + fVar26 * local_88 + fVar35);
  *(float *)&(local_140._M_head_impl)->mPositionKeys =
       fVar37 + fVar36 + fVar26 * 0.0 + fVar34 * local_48;
  *(float *)((long)&(local_140._M_head_impl)->mPositionKeys + 4) =
       local_98 * fVar10 + fVar13 + fVar37;
  (local_140._M_head_impl)->mNumRotationKeys = (uint)fVar20;
  *(ulong *)&(local_140._M_head_impl)->field_0x414 =
       CONCAT44(fVar22 + fVar32 + fVar24 * 0.0 + fVar29 * local_48,
                fVar22 + fVar32 + fVar24 * local_88 + fVar30);
  *(float *)((long)&(local_140._M_head_impl)->mRotationKeys + 4) =
       local_98 * fVar12 + fVar25 + fVar22;
  (local_140._M_head_impl)->mNumScalingKeys = (uint)(fVar25 + fVar32 + local_134 + 0.0);
  *(ulong *)&(local_140._M_head_impl)->field_0x424 =
       CONCAT44(fVar23 + fVar11 * 0.0 + fVar33 * 0.0 + fVar14 * local_48,
                fVar23 + fVar11 * 0.0 + fVar33 * local_88 + fVar16);
  *(float *)((long)&(local_140._M_head_impl)->mScalingKeys + 4) =
       local_98 * fVar11 + fVar17 + fVar23;
  (local_140._M_head_impl)->mPreState = (aiAnimBehaviour)(local_78 + 0.0 + fVar11 * 0.0 + fVar17);
  (local_140._M_head_impl)->mPostState =
       (aiAnimBehaviour)(fVar27 * 0.0 + fVar21 + fVar15 * local_88 + 0.0);
  local_140._M_head_impl[1].mNodeName.length =
       (ai_uint32)(fVar27 * 0.0 + fVar19 * local_48 + fVar15 * 0.0 + 0.0);
  *(float *)local_140._M_head_impl[1].mNodeName.data = fVar27 * local_98 + fVar18 + 0.0;
  *(float *)((long)local_140._M_head_impl[1].mNodeName.data + 4) = fVar27 * 0.0 + fVar18 + 1.0;
  local_148._M_head_impl = (aiNodeAnim *)0x0;
  local_118 = (uint *)0x0;
  local_128 = (void *)0x0;
  iStack_120._M_current = (uint *)0x0;
  local_f8 = (aiNode **)0x0;
  local_108 = (void *)0x0;
  iStack_100._M_current = (aiNode **)0x0;
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    local_d0 = local_d0 >> 3;
    do {
      ReadChunk_abi_cxx11_(&local_c8,this);
      iVar4 = std::__cxx11::string::compare((char *)&local_c8);
      if (iVar4 == 0) {
        puVar2 = (this->_meshes).
                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->_meshes).
                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ReadMESH(this);
        uVar9 = (ulong)((long)puVar3 - (long)puVar2) >> 3;
        local_130 = (aiNode *)CONCAT44(local_130._4_4_,(uint)uVar9);
        if ((uint)uVar9 <
            (uint)((ulong)((long)(this->_meshes).
                                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_meshes).
                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          do {
            if (iStack_120._M_current == local_118) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,iStack_120,
                         (uint *)&local_130);
            }
            else {
              *iStack_120._M_current = (uint)uVar9;
              iStack_120._M_current = iStack_120._M_current + 1;
            }
            uVar8 = (int)local_130 + 1;
            uVar9 = (ulong)uVar8;
            local_130 = (aiNode *)CONCAT44(local_130._4_4_,uVar8);
          } while (uVar8 < (uint)((ulong)((long)(this->_meshes).
                                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->_meshes).
                                               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_c8);
        if (iVar4 == 0) {
          ReadBONE(this,(int)local_d0);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_c8);
          if (iVar4 == 0) {
            ReadANIM(this);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_c8);
            if (iVar4 == 0) {
              _Var5._M_head_impl = local_148._M_head_impl;
              if ((aiNode *)local_148._M_head_impl == (aiNode *)0x0) {
                _Var5._M_head_impl = (aiNodeAnim *)operator_new(0x438);
                (((aiNode *)_Var5._M_head_impl)->mName).length = 0;
                (((aiNode *)_Var5._M_head_impl)->mName).data[0] = '\0';
                memset((((aiNode *)_Var5._M_head_impl)->mName).data + 1,0x1b,0x3ff);
                (((aiNode *)_Var5._M_head_impl)->mTransformation).b2 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).b3 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).b4 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).a1 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).a2 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).a3 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).a4 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).c2 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).c3 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).c4 = 0.0;
                (((aiNode *)_Var5._M_head_impl)->mTransformation).d1 = 0.0;
                local_148._M_head_impl = _Var5._M_head_impl;
                if (_Var5._M_head_impl != local_140._M_head_impl) {
                  uVar8 = ((local_140._M_head_impl)->mNodeName).length;
                  (((aiNode *)_Var5._M_head_impl)->mName).length = uVar8;
                  memcpy((((aiNode *)_Var5._M_head_impl)->mName).data,
                         ((local_140._M_head_impl)->mNodeName).data,(ulong)uVar8);
                  (((aiNode *)_Var5._M_head_impl)->mName).data[uVar8] = '\0';
                }
              }
              ReadKEYS(this,_Var5._M_head_impl);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_c8);
              if (iVar4 == 0) {
                local_130 = ReadNODE(this,(aiNode *)local_140._M_head_impl);
                if (iStack_100._M_current == local_f8) {
                  std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                            ((vector<aiNode*,std::allocator<aiNode*>> *)&local_108,iStack_100,
                             &local_130);
                }
                else {
                  *iStack_100._M_current = local_130;
                  iStack_100._M_current = iStack_100._M_current + 1;
                }
              }
            }
          }
        }
      }
      puVar6 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = puVar6[-1];
      puVar6 = puVar6 + -1;
      this->_pos = uVar8;
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        puVar6 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar8 = this->_pos;
      }
    } while (puVar6[-1] != uVar8);
    if ((aiNode *)local_148._M_head_impl != (aiNode *)0x0) {
      std::
      vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
      ::emplace_back<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>
                ((vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
                  *)&this->_nodeAnims,
                 (unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)&local_148);
    }
  }
  __src_00 = local_128;
  _Var5._M_head_impl = local_140._M_head_impl;
  uVar9 = (long)iStack_120._M_current - (long)local_128 >> 2;
  *(int *)((long)local_140._M_head_impl[1].mNodeName.data + 0x24) = (int)uVar9;
  if ((long)iStack_120._M_current - (long)local_128 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = operator_new__(-(ulong)(uVar9 >> 0x3e != 0) |
                            (long)iStack_120._M_current - (long)local_128);
    memcpy(pvVar7,__src_00,(uVar9 + (uVar9 == 0)) * 4);
  }
  __src = local_108;
  *(void **)((long)_Var5._M_head_impl[1].mNodeName.data + 0x2c) = pvVar7;
  uVar9 = (long)iStack_100._M_current - (long)local_108 >> 3;
  *(int *)((long)_Var5._M_head_impl[1].mNodeName.data + 0x14) = (int)uVar9;
  if ((long)iStack_100._M_current - (long)local_108 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = operator_new__(-(ulong)(uVar9 >> 0x3d != 0) |
                            (long)iStack_100._M_current - (long)local_108);
    memcpy(pvVar7,__src,(uVar9 + (uVar9 == 0)) * 8);
  }
  *(void **)((long)_Var5._M_head_impl[1].mNodeName.data + 0x1c) = pvVar7;
  if (__src != (void *)0x0) {
    operator_delete(__src,(long)local_f8 - (long)__src);
    __src_00 = local_128;
  }
  if (__src_00 != (void *)0x0) {
    operator_delete(__src_00,(long)local_118 - (long)__src_00);
  }
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr
            ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return (aiNode *)_Var5._M_head_impl;
}

Assistant:

aiNode *B3DImporter::ReadNODE( aiNode *parent ){

    string name=ReadString();
    aiVector3D t=ReadVec3();
    aiVector3D s=ReadVec3();
    aiQuaternion r=ReadQuat();

    aiMatrix4x4 trans,scale,rot;

    aiMatrix4x4::Translation( t,trans );
    aiMatrix4x4::Scaling( s,scale );
    rot=aiMatrix4x4( r.GetMatrix() );

    aiMatrix4x4 tform=trans * rot * scale;

    int nodeid=static_cast<int>(_nodes.size());

    aiNode *node=new aiNode( name );
    _nodes.push_back( node );

    node->mParent=parent;
    node->mTransformation=tform;

    std::unique_ptr<aiNodeAnim> nodeAnim;
    vector<unsigned> meshes;
    vector<aiNode*> children;

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="MESH" ){
            unsigned int n= static_cast<unsigned int>(_meshes.size());
            ReadMESH();
            for( unsigned int i=n;i<static_cast<unsigned int>(_meshes.size());++i ){
                meshes.push_back( i );
            }
        }else if( t=="BONE" ){
            ReadBONE( nodeid );
        }else if( t=="ANIM" ){
            ReadANIM();
        }else if( t=="KEYS" ){
            if( !nodeAnim ){
                nodeAnim.reset(new aiNodeAnim);
                nodeAnim->mNodeName=node->mName;
            }
            ReadKEYS( nodeAnim.get() );
        }else if( t=="NODE" ){
            aiNode *child=ReadNODE( node );
            children.push_back( child );
        }
        ExitChunk();
    }

    if (nodeAnim) {
        _nodeAnims.emplace_back( std::move(nodeAnim) );
    }

    node->mNumMeshes= static_cast<unsigned int>(meshes.size());
    node->mMeshes=to_array( meshes );

    node->mNumChildren=static_cast<unsigned int>(children.size());
    node->mChildren=to_array( children );

    return node;
}